

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::address_of_expression(CompilerGLSL *this,string *expr)

{
  ulong uVar1;
  char *pcVar2;
  ulong in_RDX;
  undefined1 local_70 [80];
  ulong local_20;
  string *expr_local;
  CompilerGLSL *this_local;
  
  local_20 = in_RDX;
  expr_local = expr;
  this_local = this;
  uVar1 = ::std::__cxx11::string::size();
  if ((((3 < uVar1) &&
       (pcVar2 = (char *)::std::__cxx11::string::operator[](local_20), *pcVar2 == '(')) &&
      (pcVar2 = (char *)::std::__cxx11::string::operator[](local_20), *pcVar2 == '*')) &&
     (pcVar2 = (char *)::std::__cxx11::string::back(), *pcVar2 == ')')) {
    ::std::__cxx11::string::size();
    ::std::__cxx11::string::substr((ulong)(local_70 + 0x30),local_20);
    enclose_expression(this,expr);
    ::std::__cxx11::string::~string((string *)(local_70 + 0x30));
    return this;
  }
  pcVar2 = (char *)::std::__cxx11::string::front();
  if (*pcVar2 == '*') {
    ::std::__cxx11::string::substr((ulong)this,local_20);
  }
  else {
    local_70[0x23] = 0x26;
    enclose_expression((CompilerGLSL *)local_70,expr);
    join<char,std::__cxx11::string>
              ((spirv_cross *)this,local_70 + 0x23,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
    ::std::__cxx11::string::~string((string *)local_70);
  }
  return this;
}

Assistant:

string CompilerGLSL::address_of_expression(const std::string &expr)
{
	if (expr.size() > 3 && expr[0] == '(' && expr[1] == '*' && expr.back() == ')')
	{
		// If we have an expression which looks like (*foo), taking the address of it is the same as stripping
		// the first two and last characters. We might have to enclose the expression.
		// This doesn't work for cases like (*foo + 10),
		// but this is an r-value expression which we cannot take the address of anyways.
		return enclose_expression(expr.substr(2, expr.size() - 3));
	}
	else if (expr.front() == '*')
	{
		// If this expression starts with a dereference operator ('*'), then
		// just return the part after the operator.
		return expr.substr(1);
	}
	else
		return join('&', enclose_expression(expr));
}